

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O0

int curl_strnequal(char *first,char *second,size_t max)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  size_t local_28;
  size_t max_local;
  char *second_local;
  char *first_local;
  
  local_28 = max;
  max_local = (size_t)second;
  second_local = first;
  while( true ) {
    bVar3 = false;
    if ((*second_local != '\0') && (bVar3 = false, *(char *)max_local != '\0')) {
      bVar3 = local_28 != 0;
    }
    if (!bVar3) break;
    iVar1 = toupper((int)*second_local);
    iVar2 = toupper((int)*(char *)max_local);
    if (iVar1 != iVar2) break;
    local_28 = local_28 - 1;
    second_local = second_local + 1;
    max_local = max_local + 1;
  }
  if (local_28 == 0) {
    first_local._4_4_ = 1;
  }
  else {
    iVar1 = toupper((int)*second_local);
    iVar2 = toupper((int)*(char *)max_local);
    first_local._4_4_ = (uint)(iVar1 == iVar2);
  }
  return first_local._4_4_;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
#if defined(HAVE_STRNCASECMP)
  return !strncasecmp(first, second, max);
#elif defined(HAVE_STRNCMPI)
  return !strncmpi(first, second, max);
#elif defined(HAVE_STRNICMP)
  return !strnicmp(first, second, max);
#else
  while(*first && *second && max) {
    if(toupper(*first) != toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return toupper(*first) == toupper(*second);
#endif
}